

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# coded_stream.cc
# Opt level: O0

pair<unsigned_long,_bool> __thiscall
google::protobuf::io::CodedInputStream::ReadVarint64Fallback(CodedInputStream *this)

{
  int iVar1;
  char *failure_msg;
  LogMessage *pLVar2;
  pair<int,_bool> pVar3;
  undefined8 extraout_RDX;
  pair<bool,_const_unsigned_char_*> pVar4;
  pair<unsigned_long,_bool> pVar5;
  pair<unsigned_long,_bool> pVar6;
  bool local_d9;
  bool success;
  uint64_t temp_1;
  bool local_be;
  bool local_bd;
  int local_bc;
  pair<int,_bool> local_b8;
  byte local_b0;
  pair<bool,_const_unsigned_char_*> p;
  uint64_t temp;
  CodedInputStream *this_local;
  bool local_88;
  bool local_79;
  uint8_t *local_78;
  bool local_69;
  uint8_t *local_68;
  uint8_t *next;
  LogMessage local_50;
  Voidify local_39;
  int local_38;
  uchar local_31;
  Nullable<const_char_*> local_30;
  Nullable<const_char_*> absl_log_internal_check_op_result;
  uchar *local_20;
  byte local_18;
  uint8_t *local_10;
  
  iVar1 = BufferSize(this);
  if ((iVar1 < 10) &&
     ((this->buffer_end_ <= this->buffer_ || ((this->buffer_end_[-1] & 0x80) != 0)))) {
    local_d9 = ReadVarint64Slow(this,(uint64_t *)&stack0xffffffffffffff28);
    pVar5 = std::make_pair<unsigned_long&,bool&>
                      ((unsigned_long *)&stack0xffffffffffffff28,&local_d9);
    local_88 = pVar5.second;
    goto LAB_007edc52;
  }
  local_20 = this->buffer_;
  absl_log_internal_check_op_result = (Nullable<const_char_*>)&p.second;
  local_31 = absl::lts_20250127::log_internal::GetReferenceableValue(*local_20);
  local_38 = absl::lts_20250127::log_internal::GetReferenceableValue(0x80);
  local_30 = absl::lts_20250127::log_internal::Check_GEImpl<unsigned_char,int>
                       (&local_31,&local_38,"buffer[0] >= 128");
  if (local_30 != (Nullable<const_char_*>)0x0) {
    failure_msg = absl::lts_20250127::implicit_cast<char_const*>(local_30);
    absl::lts_20250127::log_internal::LogMessageFatal::LogMessageFatal
              ((LogMessageFatal *)&local_50,
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/io/coded_stream.cc"
               ,0x1da,failure_msg);
    pLVar2 = absl::lts_20250127::log_internal::LogMessage::InternalStream(&local_50);
    absl::lts_20250127::log_internal::Voidify::operator&&(&local_39,pLVar2);
    absl::lts_20250127::log_internal::LogMessageFatal::~LogMessageFatal
              ((LogMessageFatal *)&local_50);
  }
  if (local_20[1] < 0x80) {
    local_68 = io::(anonymous_namespace)::DecodeVarint64KnownSize<2ul>
                         (local_20,(uint64_t *)absl_log_internal_check_op_result);
LAB_007edb27:
    local_79 = true;
    pVar4 = std::make_pair<bool,unsigned_char_const*&>(&local_79,&local_68);
    local_10 = pVar4.second;
    local_18 = pVar4.first;
  }
  else {
    if (local_20[2] < 0x80) {
      local_68 = io::(anonymous_namespace)::DecodeVarint64KnownSize<3ul>
                           (local_20,(uint64_t *)absl_log_internal_check_op_result);
      goto LAB_007edb27;
    }
    if (local_20[3] < 0x80) {
      local_68 = io::(anonymous_namespace)::DecodeVarint64KnownSize<4ul>
                           (local_20,(uint64_t *)absl_log_internal_check_op_result);
      goto LAB_007edb27;
    }
    if (local_20[4] < 0x80) {
      local_68 = io::(anonymous_namespace)::DecodeVarint64KnownSize<5ul>
                           (local_20,(uint64_t *)absl_log_internal_check_op_result);
      goto LAB_007edb27;
    }
    if (local_20[5] < 0x80) {
      local_68 = io::(anonymous_namespace)::DecodeVarint64KnownSize<6ul>
                           (local_20,(uint64_t *)absl_log_internal_check_op_result);
      goto LAB_007edb27;
    }
    if (local_20[6] < 0x80) {
      local_68 = io::(anonymous_namespace)::DecodeVarint64KnownSize<7ul>
                           (local_20,(uint64_t *)absl_log_internal_check_op_result);
      goto LAB_007edb27;
    }
    if (local_20[7] < 0x80) {
      local_68 = io::(anonymous_namespace)::DecodeVarint64KnownSize<8ul>
                           (local_20,(uint64_t *)absl_log_internal_check_op_result);
      goto LAB_007edb27;
    }
    if (local_20[8] < 0x80) {
      local_68 = io::(anonymous_namespace)::DecodeVarint64KnownSize<9ul>
                           (local_20,(uint64_t *)absl_log_internal_check_op_result);
      goto LAB_007edb27;
    }
    if (local_20[9] < 0x80) {
      local_68 = io::(anonymous_namespace)::DecodeVarint64KnownSize<10ul>
                           (local_20,(uint64_t *)absl_log_internal_check_op_result);
      goto LAB_007edb27;
    }
    local_69 = false;
    local_78 = local_20 + 0xb;
    pVar4 = std::make_pair<bool,unsigned_char_const*>(&local_69,&local_78);
    local_10 = pVar4.second;
    local_18 = pVar4.first;
  }
  local_b0 = local_18;
  p._0_8_ = local_10;
  if ((local_18 & 1) == 0) {
    local_bc = 0;
    local_bd = false;
    pVar3 = std::make_pair<int,bool>(&local_bc,&local_bd);
    local_b8.first = pVar3.first;
    local_b8.second = pVar3.second;
    std::pair<unsigned_long,_bool>::pair<int,_bool,_true>
              ((pair<unsigned_long,_bool> *)&this_local,&local_b8);
    pVar5._8_8_ = extraout_RDX;
    pVar5.first = (unsigned_long)this_local;
  }
  else {
    this->buffer_ = local_10;
    local_be = true;
    pVar5 = std::make_pair<unsigned_long&,bool>((unsigned_long *)&p.second,&local_be);
    local_88 = pVar5.second;
  }
LAB_007edc52:
  this_local = (CodedInputStream *)pVar5.first;
  pVar6._9_7_ = pVar5._9_7_;
  pVar6.second = local_88;
  pVar6.first = (unsigned_long)this_local;
  return pVar6;
}

Assistant:

std::pair<uint64_t, bool> CodedInputStream::ReadVarint64Fallback() {
  if (BufferSize() >= kMaxVarintBytes ||
      // Optimization:  We're also safe if the buffer is non-empty and it ends
      // with a byte that would terminate a varint.
      (buffer_end_ > buffer_ && !(buffer_end_[-1] & 0x80))) {
    uint64_t temp;
    ::std::pair<bool, const uint8_t*> p = ReadVarint64FromArray(buffer_, &temp);
    if (!p.first) {
      return std::make_pair(0, false);
    }
    buffer_ = p.second;
    return std::make_pair(temp, true);
  } else {
    uint64_t temp;
    bool success = ReadVarint64Slow(&temp);
    return std::make_pair(temp, success);
  }
}